

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O1

String testing::internal::GetTypeName<double>(void)

{
  uint in_EAX;
  char *__ptr;
  size_t extraout_RDX;
  String *in_RDI;
  char *a_c_str;
  String SVar1;
  int status;
  undefined8 uStack_28;
  
  a_c_str = _typeinfo + (*_typeinfo == '*');
  uStack_28 = (ulong)in_EAX;
  __ptr = (char *)__cxa_demangle(a_c_str,0,0,(long)&uStack_28 + 4);
  if (uStack_28._4_4_ == 0) {
    a_c_str = __ptr;
  }
  String::String(in_RDI,a_c_str);
  free(__ptr);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

String GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if defined(__GLIBCXX__) || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   ifdef __GLIBCXX__
  using abi::__cxa_demangle;
#   endif // __GLIBCXX__
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const String name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // __GLIBCXX__ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}